

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
ft::
vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::push_back(vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *this,value_type *val)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer pcVar3;
  ulong uVar4;
  size_t in_RDX;
  
  uVar4 = this->m_size;
  if (this->m_capacity <= uVar4) {
    realloc(this,(void *)(this->m_capacity * 2),in_RDX);
    uVar4 = this->m_size;
  }
  ppVar2 = this->m_data;
  ppVar1 = ppVar2 + uVar4;
  (ppVar1->first)._M_dataplus._M_p = (pointer)&(ppVar1->first).field_2;
  pcVar3 = (val->first)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(ppVar2 + uVar4),pcVar3,pcVar3 + (val->first)._M_string_length);
  ppVar1->second = val->second;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void		push_back(value_type const & val) {
		if (this->size() >= this->capacity())
			this->realloc(this->capacity() * 2);
		this->get_allocator().construct(this->m_data + this->size(), val);
		++this->m_size;
	}